

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

bool __thiscall
double_conversion::FastFixedDtoa
          (double_conversion *this,double v,int fractional_count,Vector<char> buffer,int *length,
          int *decimal_point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t number;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t d64;
  byte bVar6;
  int *piVar7;
  int iVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  long lVar10;
  int *length_00;
  int fractional_count_00;
  ulong uVar11;
  bool bVar12;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int *in_stack_ffffffffffffffb8;
  
  buffer_00.start_ = (char *)CONCAT44(in_register_00000034,fractional_count);
  buffer_04._8_8_ = buffer._8_8_;
  bVar12 = ((ulong)v & 0x7ff0000000000000) == 0;
  uVar11 = ((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar12) {
    uVar11 = (ulong)v & 0xfffffffffffff;
  }
  uVar3 = 0xfffffbce;
  if (!bVar12) {
    uVar3 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  fractional_count_00 = (int)this;
  bVar12 = fractional_count_00 < 0x15 && (int)uVar3 < 0x15;
  if (fractional_count_00 >= 0x15 || (int)uVar3 >= 0x15) {
    return bVar12;
  }
  *buffer_04._8_8_ = 0;
  bVar6 = (byte)uVar3;
  if (0xb < (int)uVar3) {
    if (uVar3 < 0x12) {
      uVar9 = 0xb1a2bc2ec5 << (0x11 - bVar6 & 0x3f);
      number = (uint32_t)(uVar11 / uVar9);
      piVar7 = (int *)(ulong)uVar3;
      uVar11 = uVar11 % uVar9 << (bVar6 & 0x3f);
    }
    else {
      uVar11 = uVar11 << (bVar6 - 0x11 & 0x3f);
      piVar7 = (int *)0xb1a2bc2ec5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar11;
      number = SUB164(auVar1 / ZEXT816(0xb1a2bc2ec5),0);
      uVar11 = uVar11 % 0xb1a2bc2ec5 << 0x11;
    }
    buffer_01._8_8_ = buffer_04._8_8_;
    buffer_01.start_ = buffer_00.start_;
    length_00 = length;
    FillDigits32(number,buffer_01,piVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar11;
    buffer_04.start_ = buffer_00.start_;
    FillDigits32FixedLength(SUB164(auVar2 / ZEXT816(100000000000000),0),3,buffer_04,length_00);
    buffer_05._8_8_ = buffer_04._8_8_;
    buffer_05.start_ = buffer_00.start_;
    FillDigits32FixedLength((uint32_t)((uVar11 / 10000000) % 10000000),7,buffer_05,length_00);
    buffer_06._8_8_ = buffer_04._8_8_;
    buffer_06.start_ = buffer_00.start_;
    FillDigits32FixedLength((uint32_t)(uVar11 % 10000000),7,buffer_06,length_00);
    *length = *buffer_04._8_8_;
    goto LAB_00396d9f;
  }
  if ((int)uVar3 < 0) {
    if (uVar3 < 0xffffffcc) {
      if (uVar3 < 0xffffff80) {
        *buffer_00.start_ = '\0';
        *buffer_04._8_8_ = 0;
        uVar3 = -fractional_count_00;
        goto LAB_00396c62;
      }
      *length = 0;
    }
    else {
      bVar6 = -bVar6;
      piVar7 = (int *)(ulong)CONCAT31((int3)(uVar3 >> 8),bVar6);
      uVar9 = uVar11 >> (bVar6 & 0x3f);
      uVar11 = uVar11 - (uVar9 << (bVar6 & 0x3f));
      if (uVar9 >> 0x20 == 0) {
        buffer_03._8_8_ = buffer_04._8_8_;
        buffer_03.start_ = buffer_00.start_;
        FillDigits32((uint32_t)uVar9,buffer_03,piVar7);
      }
      else {
        buffer_02._8_8_ = buffer_04._8_8_;
        buffer_02.start_ = buffer_00.start_;
        FillDigits64(uVar9,buffer_02,piVar7);
      }
      *length = *buffer_04._8_8_;
    }
    buffer_07._8_8_ = buffer_04._8_8_;
    buffer_07.start_ = buffer_00.start_;
    FillFractionals(uVar11,uVar3,fractional_count_00,buffer_07,length,in_stack_ffffffffffffffb8);
  }
  else {
    buffer_00._8_8_ = buffer_04._8_8_;
    FillDigits64(uVar11 << (bVar6 & 0x3f),buffer_00,(int *)(ulong)uVar3);
    uVar3 = *buffer_04._8_8_;
LAB_00396c62:
    *length = uVar3;
  }
LAB_00396d9f:
  uVar3 = *buffer_04._8_8_;
  uVar4 = (int)uVar3 >> 0x1f & uVar3;
  while ((uVar5 = uVar4, 0 < (int)uVar3 && (uVar5 = uVar3, buffer_00.start_[uVar3 - 1] == '0'))) {
    uVar3 = uVar3 - 1;
    *buffer_04._8_8_ = uVar3;
  }
  uVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar5) {
    uVar11 = (ulong)uVar5;
  }
  do {
    if (uVar11 == uVar9) {
LAB_00396de0:
      iVar8 = (int)uVar11;
      if (iVar8 != 0) {
        for (lVar10 = 0; (long)(uVar11 + lVar10) < (long)(int)uVar5; lVar10 = lVar10 + 1) {
          buffer_00.start_[lVar10] = buffer_00.start_[lVar10 + uVar11];
          uVar5 = *buffer_04._8_8_;
        }
        *buffer_04._8_8_ = uVar5 - iVar8;
        *length = *length - iVar8;
        uVar3 = *buffer_04._8_8_;
      }
      buffer_00.start_[(int)uVar3] = '\0';
      if (*buffer_04._8_8_ == 0) {
        *length = -fractional_count_00;
      }
      return bVar12;
    }
    if (buffer_00.start_[uVar9] != '0') {
      uVar11 = uVar9 & 0xffffffff;
      goto LAB_00396de0;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = DOUBLE_CONVERSION_UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    DOUBLE_CONVERSION_ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimic
    // Gay's dtoa and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}